

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat.cpp
# Opt level: O3

void ncnn::copy_make_border
               (Mat *src,Mat *dst,int top,int bottom,int left,int right,int type,float v,
               Allocator *allocator,int num_threads)

{
  int *piVar1;
  long lVar2;
  long *plVar3;
  Layer *pLVar4;
  long lVar5;
  Option opt;
  ParamDict pd;
  ParamDict local_540;
  
  pLVar4 = create_layer(0x2b);
  ParamDict::ParamDict(&local_540);
  ParamDict::set(&local_540,0,top);
  ParamDict::set(&local_540,1,bottom);
  ParamDict::set(&local_540,2,left);
  ParamDict::set(&local_540,3,right);
  ParamDict::set(&local_540,4,type);
  ParamDict::set(&local_540,5,v);
  (*pLVar4->_vptr_Layer[2])(pLVar4,&local_540);
  get_default_option();
  (*pLVar4->_vptr_Layer[5])(pLVar4,src,dst);
  (*pLVar4->_vptr_Layer[1])(pLVar4);
  lVar5 = 0x4d8;
  do {
    piVar1 = *(int **)((long)local_540.params + lVar5 + -8);
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        lVar2 = *(long *)((long)local_540.params + lVar5 + -0x10);
        plVar3 = *(long **)((long)&local_540.params[0].v.data + lVar5);
        if (plVar3 == (long *)0x0) {
          if (lVar2 != 0) {
            free(*(void **)(lVar2 + -8));
          }
        }
        else {
          (**(code **)(*plVar3 + 8))();
        }
      }
    }
    *(undefined8 *)((long)local_540.params + lVar5 + -0x10) = 0;
    *(undefined8 *)((long)local_540.params + lVar5 + -8) = 0;
    *(undefined8 *)((long)&local_540.params[0].loaded + lVar5) = 0;
    *(undefined8 *)((long)&local_540.params[0].v.allocator + lVar5) = 0;
    *(undefined8 *)((long)&local_540.params[0].v.refcount + lVar5) = 0;
    *(undefined8 *)((long)&local_540.params[0].v.elemsize + lVar5) = 0;
    lVar5 = lVar5 + -0x40;
  } while (lVar5 != -0x28);
  return;
}

Assistant:

void copy_make_border(const Mat& src, Mat& dst, int top, int bottom, int left, int right, int type, float v, Allocator* allocator, int num_threads)
{
    ncnn::Layer* padding = ncnn::create_layer(ncnn::LayerType::Padding);

    ncnn::ParamDict pd;
    pd.set(0, top);
    pd.set(1, bottom);
    pd.set(2, left);
    pd.set(3, right);
    pd.set(4, type);
    pd.set(5, v);

    padding->load_param(pd);

    ncnn::Option opt = ncnn::get_default_option();
    opt.num_threads = num_threads;
    opt.blob_allocator = allocator;

    padding->forward(src, dst, opt);

    delete padding;
}